

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uo_cb_thrdpool.c
# Opt level: O0

_Bool uo_cb_thrdpool_init(void)

{
  int iVar1;
  _Bool local_9;
  
  if (is_init) {
    local_9 = true;
  }
  else {
    is_init = true;
    iVar1 = sem_init((sem_t *)&thrdpool.update_sem,0,0);
    is_init = (is_init & 1U & iVar1 == 0) != 0;
    thrdpool.is_paused = false;
    thrdpool.thrd_count = 0;
    thrdpool.executing_count = 0;
    thrdpool.sample.completions = 0;
    iVar1 = pthread_create(&thrdpool.manager_thrd,(pthread_attr_t *)0x0,uo_cb_manage_thrds,
                           (void *)0x0);
    is_init = iVar1 == 0;
    atexit(uo_cb_thrdpool_quit);
    local_9 = (_Bool)(is_init & 1);
  }
  return local_9;
}

Assistant:

bool uo_cb_thrdpool_init()
{
    if (is_init)
        return true;

    is_init = true;

    is_init &= sem_init(&thrdpool.update_sem, 0, 0) == 0;

    atomic_init(&thrdpool.is_paused, false);
    atomic_init(&thrdpool.thrd_count, 0);
    atomic_init(&thrdpool.executing_count, 0);
    atomic_init(&thrdpool.sample.completions, 0);

    is_init = pthread_create(&thrdpool.manager_thrd, NULL, uo_cb_manage_thrds, NULL) == 0;

    atexit(uo_cb_thrdpool_quit);

    return is_init;
}